

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int yy_lac_stack_realloc
              (long *yycapacity,long yyadd,yy_state_t **yybottom,yy_state_t *yybottom_no_free,
              yy_state_t **yytop,yy_state_t *yytop_empty)

{
  long lVar1;
  yy_state_t *__dest;
  long local_68;
  yy_state_t *yybottom_new;
  long yyalloc;
  long yysize_new;
  long yysize_old;
  yy_state_t *yytop_empty_local;
  yy_state_t **yytop_local;
  yy_state_t *yybottom_no_free_local;
  yy_state_t **yybottom_local;
  long yyadd_local;
  long *yycapacity_local;
  
  if (*yytop == yytop_empty) {
    local_68 = 0;
  }
  else {
    local_68 = ((long)*yytop - (long)*yybottom >> 1) + 1;
  }
  lVar1 = local_68 + yyadd;
  if (*yycapacity < lVar1) {
    yybottom_new = (yy_state_t *)(lVar1 * 2);
    if (10000 < lVar1) {
      return -2;
    }
    if (10000 < (long)yybottom_new) {
      yybottom_new = (yy_state_t *)0x2710;
    }
    __dest = (yy_state_t *)malloc((long)yybottom_new << 1);
    if (__dest == (yy_state_t *)0x0) {
      return -2;
    }
    if (*yytop != yytop_empty) {
      memcpy(__dest,*yybottom,local_68 << 1);
      *yytop = __dest + local_68 + -1;
    }
    if (*yybottom != yybottom_no_free) {
      free(*yybottom);
    }
    *yybottom = __dest;
    *yycapacity = (long)yybottom_new;
  }
  return 0;
}

Assistant:

static int
yy_lac_stack_realloc (YYPTRDIFF_T *yycapacity, YYPTRDIFF_T yyadd,
#if YYDEBUG
                      char const *yydebug_prefix,
                      char const *yydebug_suffix,
#endif
                      yy_state_t **yybottom,
                      yy_state_t *yybottom_no_free,
                      yy_state_t **yytop, yy_state_t *yytop_empty)
{
  YYPTRDIFF_T yysize_old =
    *yytop == yytop_empty ? 0 : *yytop - *yybottom + 1;
  YYPTRDIFF_T yysize_new = yysize_old + yyadd;
  if (*yycapacity < yysize_new)
    {
      YYPTRDIFF_T yyalloc = 2 * yysize_new;
      yy_state_t *yybottom_new;
      /* Use YYMAXDEPTH for maximum stack size given that the stack
         should never need to grow larger than the main state stack
         needs to grow without LAC.  */
      if (YYMAXDEPTH < yysize_new)
        {
          YYDPRINTF ((stderr, "%smax size exceeded%s", yydebug_prefix,
                      yydebug_suffix));
          return YYENOMEM;
        }
      if (YYMAXDEPTH < yyalloc)
        yyalloc = YYMAXDEPTH;
      yybottom_new =
        YY_CAST (yy_state_t *,
                 YYSTACK_ALLOC (YY_CAST (YYSIZE_T,
                                         yyalloc * YYSIZEOF (*yybottom_new))));
      if (!yybottom_new)
        {
          YYDPRINTF ((stderr, "%srealloc failed%s", yydebug_prefix,
                      yydebug_suffix));
          return YYENOMEM;
        }
      if (*yytop != yytop_empty)
        {
          YYCOPY (yybottom_new, *yybottom, yysize_old);
          *yytop = yybottom_new + (yysize_old - 1);
        }
      if (*yybottom != yybottom_no_free)
        YYSTACK_FREE (*yybottom);
      *yybottom = yybottom_new;
      *yycapacity = yyalloc;
    }
  return 0;
}